

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::FullyConnectedLayer::calcPropagatedErrors(FullyConnectedLayer *this)

{
  element_type *peVar1;
  size_t j;
  ulong uVar2;
  float *pfVar3;
  float *y_begin;
  float *x_begin;
  float fVar4;
  
  pfVar3 = (float *)(this->propagatedErrors)._M_size;
  if (pfVar3 != (float *)this->nInputs) {
    std::valarray<float>::resize(&this->propagatedErrors,this->nInputs,0.0);
    pfVar3 = (float *)(this->propagatedErrors)._M_size;
  }
  if (pfVar3 != (float *)0x0) {
    pfVar3 = (this->propagatedErrors)._M_data;
  }
  peVar1 = (this->weights).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  y_begin = (float *)(this->localGrad)._M_size;
  x_begin = (float *)peVar1->_M_size;
  if (x_begin != (float *)0x0) {
    x_begin = peVar1->_M_data;
  }
  if (y_begin != (float *)0x0) {
    y_begin = (this->localGrad)._M_data;
  }
  for (uVar2 = 0; uVar2 < this->nInputs; uVar2 = uVar2 + 1) {
    fVar4 = internal::dot<float*,float*>(this->nOutputs,x_begin,this->nInputs,y_begin,1);
    pfVar3[uVar2] = fVar4;
    x_begin = x_begin + 1;
  }
  return;
}

Assistant:

void calcPropagatedErrors() {
        if (propagatedErrors.size() != nInputs) {
            propagatedErrors.resize(nInputs);
        }
        // propagated errors are dot products between columns of the
        // weight matrix $w_{kj} and local gradient $\\delta_j$;
        auto e_begin = std::begin(propagatedErrors); // points to e_0
        auto w_begin = std::begin(*weights);         // points to w_00
        auto delta_begin = std::begin(localGrad);    // points to delta_0
        for (size_t j = 0; j < nInputs; ++j) { // for all inputs
            float &e_j = *(e_begin + j);
            e_j = internal::dot(nOutputs, w_begin + j, nInputs, delta_begin, 1);
        }
    }